

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_slt_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGTemp *a1;
  TCGv_i64 a2;
  TCGOpcode opc_00;
  TCGCond cond;
  TCGContext_conflict6 *tcg_ctx;
  undefined6 in_register_00000082;
  uintptr_t o_1;
  TCGv_i64 arg1;
  
  if (rt == 0) {
    return;
  }
  a1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)a1 - (long)ctx);
  if (rs == 0) {
    opc_00 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_00988938:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,opc_00,(TCGArg)a1,(TCGArg)a2);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) != arg1) {
    a2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) + (long)ctx;
    opc_00 = INDEX_op_mov_i64;
    goto LAB_00988938;
  }
  if (opc == 0x28000000) {
    cond = TCG_COND_LT;
  }
  else {
    if (opc != 0x2c000000) goto LAB_00988974;
    cond = TCG_COND_LTU;
  }
  tcg_gen_setcondi_i64_mips64el
            ((TCGContext_conflict6 *)ctx,cond,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rt * 2),
             arg1,(long)(int)CONCAT62(in_register_00000082,imm));
LAB_00988974:
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(arg1 + (long)ctx));
  return;
}

Assistant:

static void gen_slt_imm(DisasContext *ctx, uint32_t opc,
                        int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = (target_long)imm; /* Sign extend to 32/64 bits */
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLTI:
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SLTIU:
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LTU, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}